

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::readResultTextures(SRGBTestCase *this)

{
  code *pcVar1;
  ulong uVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ObjectWrapper *this_00;
  size_type sVar6;
  reference pvVar7;
  PixelBufferAccess local_50;
  ulong local_28;
  size_t renderBufferIdx;
  int height;
  int width;
  Functions *gl;
  SRGBTestCase *this_local;
  
  gl = (Functions *)this;
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  _height = CONCAT44(extraout_var,iVar3);
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[4])();
  renderBufferIdx._4_4_ =
       tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_00,iVar3));
  pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[4])();
  renderBufferIdx._0_4_ =
       tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_01,iVar3));
  pcVar1 = *(code **)(_height + 0x78);
  this_00 = &de::details::
             UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
             ::operator*(&(this->m_framebuffer).
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                        )->super_ObjectWrapper;
  dVar4 = glu::ObjectWrapper::operator*(this_00);
  (*pcVar1)(0x8d40,dVar4);
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_renderBufferList);
  std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::resize
            (&this->m_textureResultList,sVar6);
  local_28 = 0;
  while( true ) {
    uVar2 = local_28;
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&this->m_renderBufferList);
    if (sVar6 <= uVar2) break;
    (**(code **)(_height + 0x1218))((int)local_28 + 0x8ce0);
    pvVar7 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::operator[]
                       (&this->m_textureResultList,local_28);
    tcu::TextureLevel::setStorage
              (pvVar7,&this->m_resultTextureFormat,renderBufferIdx._4_4_,(int)renderBufferIdx,1);
    pRVar5 = Context::getRenderContext((this->super_TestCase).m_context);
    pvVar7 = std::vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_>::operator[]
                       (&this->m_textureResultList,local_28);
    tcu::TextureLevel::getAccess(&local_50,pvVar7);
    glu::readPixels(pRVar5,0,0,&local_50);
    dVar4 = (**(code **)(_height + 0x800))();
    glu::checkError(dVar4,"glReadPixels()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                    ,0x4be);
    local_28 = local_28 + 1;
  }
  (**(code **)(_height + 0x78))(0x8d40,0);
  return;
}

Assistant:

void SRGBTestCase::readResultTextures (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	int						width	= m_context.getRenderContext().getRenderTarget().getWidth();
	int						height	= m_context.getRenderContext().getRenderTarget().getHeight();

	gl.bindFramebuffer(GL_FRAMEBUFFER, **m_framebuffer);

	m_textureResultList.resize(m_renderBufferList.size());

	for (std::size_t renderBufferIdx = 0; renderBufferIdx < m_renderBufferList.size(); renderBufferIdx++)
	{
		gl.readBuffer(GL_COLOR_ATTACHMENT0 + (glw::GLenum)renderBufferIdx);
		m_textureResultList[renderBufferIdx].setStorage(m_resultTextureFormat, width, height);
		glu::readPixels(m_context.getRenderContext(), 0, 0, m_textureResultList[renderBufferIdx].getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels()");
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
}